

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockComparatorCopierTest.cpp
# Opt level: O0

void __thiscall
TEST_MockComparatorCopierTest_customTypeOutputParameterWithIgnoredParameters_TestShell::
~TEST_MockComparatorCopierTest_customTypeOutputParameterWithIgnoredParameters_TestShell
          (TEST_MockComparatorCopierTest_customTypeOutputParameterWithIgnoredParameters_TestShell
           *this)

{
  TEST_MockComparatorCopierTest_customTypeOutputParameterWithIgnoredParameters_TestShell *this_local
  ;
  
  ~TEST_MockComparatorCopierTest_customTypeOutputParameterWithIgnoredParameters_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MockComparatorCopierTest, customTypeOutputParameterWithIgnoredParameters)
{
    MyTypeForTesting expectedObject(444537909);
    MyTypeForTesting actualObject(98765);
    MyTypeForTestingCopier copier;
    mock().installCopier("MyTypeForTesting", copier);

    mock().expectOneCall("foo").withOutputParameterOfTypeReturning("MyTypeForTesting", "bar", &expectedObject).ignoreOtherParameters();
    mock().actualCall("foo").withOutputParameterOfType("MyTypeForTesting", "bar", &actualObject).withParameter("other", 1);

    mock().checkExpectations();
    CHECK_EQUAL(444537909, *(expectedObject.value));
    CHECK_EQUAL(444537909, *(actualObject.value));

    mock().removeAllComparatorsAndCopiers();
}